

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

string * __thiscall
pbrt::ImageChannelValues::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ImageChannelValues *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::InlinedVector<float,4,pstd::pmr::polymorphic_allocator<float>>&>
            (__return_storage_ptr__,"[ ImageChannelValues %s ]",
             &this->super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageChannelValues::ToString() const {
    return StringPrintf("[ ImageChannelValues %s ]", ((InlinedVector<Float, 4> &)*this));
}